

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

string * __thiscall BMP::getUmCode_abi_cxx11_(string *__return_storage_ptr__,BMP *this,int a,int n)

{
  pointer pcVar1;
  
  getBit_abi_cxx11_(__return_storage_ptr__,this,a);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
  while (__return_storage_ptr__->_M_string_length != (long)n) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(pcVar1,pcVar1 + n);
  return __return_storage_ptr__;
}

Assistant:

std::string BMP::getUmCode(int a, int n)
{
    using namespace std;

    string x = getBit( a );

    reverse( x.begin(), x.end() );

    while ( x.size() != n )
        x += '0';

    reverse( x.begin(), x.end() );

    return x;
}